

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
* __thiscall
burst::detail::
apply_impl<burst::make_range_vector_t_const&,std::tuple<std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&>&,0ul,1ul,2ul>
          (vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,detail *this,
          tuple<const_std::vector<char,_std::allocator<char>_>_&,_const_std::vector<char,_std::allocator<char>_>_&,_const_std::vector<char,_std::allocator<char>_>_&>
          *f)

{
  vector<char,_std::allocator<char>_> *as;
  vector<char,_std::allocator<char>_> *as_1;
  vector<char,_std::allocator<char>_> *as_2;
  tuple<const_std::vector<char,_std::allocator<char>_>_&,_const_std::vector<char,_std::allocator<char>_>_&,_const_std::vector<char,_std::allocator<char>_>_&>
  *t_local;
  make_range_vector_t *f_local;
  
  as = std::
       get<0ul,std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&>
                 (f);
  as_1 = std::
         get<1ul,std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&>
                   (f);
  as_2 = std::
         get<2ul,std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&>
                   (f);
  invoke_fn::operator()
            (__return_storage_ptr__,(invoke_fn *)&burst::invoke,(make_range_vector_t *)this,as,as_1,
             as_2);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto)
            apply_impl
            (
                NaryFunction && f,
                Tuple && t,
                std::index_sequence<Indices...>
            )
        {
            return invoke(std::forward<NaryFunction>(f), std::get<Indices>(std::forward<Tuple>(t))...);
        }